

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::anonymous_mode_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,anonymous_mode_alert *this)

{
  char msg [200];
  string local_108;
  char local_e8 [208];
  
  torrent_alert::message_abi_cxx11_(&local_108,&this->super_torrent_alert);
  snprintf(local_e8,200,"%s: %s: %s",local_108._M_dataplus._M_p,
           "tracker is not anonymous, set a proxy",(this->str)._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_e8,(allocator<char> *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

std::string anonymous_mode_alert::message() const
	{
		char msg[200];
		static char const* const msgs[] = {
			"tracker is not anonymous, set a proxy"
		};
		std::snprintf(msg, sizeof(msg), "%s: %s: %s"
			, torrent_alert::message().c_str()
			, msgs[kind], str.c_str());
		return msg;
	}